

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall
spirv_cross::Compiler::BufferAccessHandler::handle
          (BufferAccessHandler *this,Op opcode,uint32_t *args,uint32_t length)

{
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *this_00;
  size_t *psVar1;
  Compiler *this_01;
  SmallVector<spirv_cross::BufferRange,_8UL> *this_02;
  BufferRange *pBVar2;
  size_t sVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  SPIRConstant *pSVar6;
  iterator iVar7;
  SPIRType *type;
  size_t sVar8;
  bool bVar9;
  __hashtable *__h;
  uint32_t index;
  __node_gen_type __node_gen;
  uint32_t local_3c;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_38;
  
  bVar9 = true;
  if (0xfffffffc < opcode - OpArrayLength) {
    if (length < (opcode == OpPtrAccessChain | 4)) {
      bVar9 = false;
    }
    else if (args[2] == this->id) {
      pSVar6 = Variant::get<spirv_cross::SPIRConstant>
                         ((this->compiler->ir).ids.super_VectorView<spirv_cross::Variant>.ptr +
                          args[(ulong)(opcode == OpPtrAccessChain) + 3]);
      local_3c = (pSVar6->m).c[0].r[0].u32;
      this_00 = &this->seen;
      iVar7 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this_00->_M_h,&local_3c);
      if (iVar7.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) {
        local_38 = this_00;
        ::std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                    *)this_00,&local_3c);
        this_01 = this->compiler;
        uVar4 = expression_type_id(this_01,this->id);
        type = Variant::get<spirv_cross::SPIRType>
                         ((this_01->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + uVar4);
        uVar4 = type_struct_member_offset(this->compiler,type,local_3c);
        if ((ulong)(local_3c + 1) <
            (type->member_types).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
            buffer_size) {
          uVar5 = type_struct_member_offset(this->compiler,type,local_3c + 1);
          sVar8 = (size_t)(uVar5 - uVar4);
        }
        else {
          sVar8 = get_declared_struct_member_size(this->compiler,type,local_3c);
        }
        uVar5 = local_3c;
        this_02 = this->ranges;
        SmallVector<spirv_cross::BufferRange,_8UL>::reserve
                  (this_02,(this_02->super_VectorView<spirv_cross::BufferRange>).buffer_size + 1);
        pBVar2 = (this_02->super_VectorView<spirv_cross::BufferRange>).ptr;
        sVar3 = (this_02->super_VectorView<spirv_cross::BufferRange>).buffer_size;
        pBVar2[sVar3].index = uVar5;
        pBVar2[sVar3].offset = (ulong)uVar4;
        pBVar2[sVar3].range = sVar8;
        psVar1 = &(this_02->super_VectorView<spirv_cross::BufferRange>).buffer_size;
        *psVar1 = *psVar1 + 1;
      }
    }
  }
  return bVar9;
}

Assistant:

bool Compiler::BufferAccessHandler::handle(Op opcode, const uint32_t *args, uint32_t length)
{
	if (opcode != OpAccessChain && opcode != OpInBoundsAccessChain && opcode != OpPtrAccessChain)
		return true;

	bool ptr_chain = (opcode == OpPtrAccessChain);

	// Invalid SPIR-V.
	if (length < (ptr_chain ? 5u : 4u))
		return false;

	if (args[2] != id)
		return true;

	// Don't bother traversing the entire access chain tree yet.
	// If we access a struct member, assume we access the entire member.
	uint32_t index = compiler.get<SPIRConstant>(args[ptr_chain ? 4 : 3]).scalar();

	// Seen this index already.
	if (seen.find(index) != end(seen))
		return true;
	seen.insert(index);

	auto &type = compiler.expression_type(id);
	uint32_t offset = compiler.type_struct_member_offset(type, index);

	size_t range;
	// If we have another member in the struct, deduce the range by looking at the next member.
	// This is okay since structs in SPIR-V can have padding, but Offset decoration must be
	// monotonically increasing.
	// Of course, this doesn't take into account if the SPIR-V for some reason decided to add
	// very large amounts of padding, but that's not really a big deal.
	if (index + 1 < type.member_types.size())
	{
		range = compiler.type_struct_member_offset(type, index + 1) - offset;
	}
	else
	{
		// No padding, so just deduce it from the size of the member directly.
		range = compiler.get_declared_struct_member_size(type, index);
	}

	ranges.push_back({ index, offset, range });
	return true;
}